

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::Bloaty::AddBuiltInSources<10ul>
          (Bloaty *this,DataSourceDefinition (*sources) [10],Options *options)

{
  _Head_base<0UL,_bloaty::ConfiguredDataSource_*,_false> __p;
  DataSource DVar1;
  pointer pCVar2;
  NameMunger *pNVar3;
  __uniq_ptr_impl<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
  *this_00;
  long lVar4;
  __single_object configured_source;
  allocator<char> local_61;
  _Head_base<0UL,_bloaty::ConfiguredDataSource_*,_false> local_60;
  Options *local_58;
  key_type local_50;
  
  lVar4 = 0;
  local_58 = options;
  do {
    pCVar2 = (pointer)operator_new(0x18);
    pCVar2->definition = (DataSourceDefinition *)((long)&(*sources)[0].number + lVar4);
    DVar1 = *(DataSource *)((long)&(*sources)[0].number + lVar4);
    pCVar2->effective_source = DVar1;
    pNVar3 = (NameMunger *)operator_new(0x18);
    *(undefined8 *)
     &(pNVar3->regexes_).
      super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         = 0;
    *(pointer *)
     ((long)&(pNVar3->regexes_).
             super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pNVar3->regexes_).
             super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     + 0x10) = (pointer)0x0;
    (pCVar2->munger)._M_t.
    super___uniq_ptr_impl<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_>._M_t.
    super__Tuple_impl<0UL,_bloaty::NameMunger_*,_std::default_delete<bloaty::NameMunger>_>.
    super__Head_base<0UL,_bloaty::NameMunger_*,_false>._M_head_impl = pNVar3;
    local_60._M_head_impl = pCVar2;
    if (DVar1 == kSymbols) {
      DVar1 = EffectiveSymbolSource(local_58);
      (local_60._M_head_impl)->effective_source = DVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)&(*sources)[0].name + lVar4),&local_61);
    this_00 = (__uniq_ptr_impl<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
                 ::operator[](&this->all_known_sources_,&local_50);
    __p._M_head_impl = local_60._M_head_impl;
    local_60._M_head_impl = (ConfiguredDataSource *)0x0;
    std::
    __uniq_ptr_impl<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
    ::reset(this_00,__p._M_head_impl);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::
    unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>::
    ~unique_ptr((unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
                 *)&local_60);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xf0);
  return;
}

Assistant:

void AddBuiltInSources(const DataSourceDefinition (&sources)[T],
                         const Options& options) {
    for (size_t i = 0; i < T; i++) {
      const DataSourceDefinition& source = sources[i];
      auto configured_source = absl::make_unique<ConfiguredDataSource>(source);

      if (configured_source->effective_source == DataSource::kSymbols) {
        configured_source->effective_source = EffectiveSymbolSource(options);
      }

      all_known_sources_[source.name] = std::move(configured_source);
    }
  }